

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void pq_base_concatenate(PacketQueueBase *qdest,PacketQueueBase *q1,PacketQueueBase *q2)

{
  size_t sVar1;
  size_t sVar2;
  PacketQueueBase *pPVar3;
  PacketQueueBase *pPVar4;
  PacketQueueBase *pPVar5;
  PacketQueueBase *pPVar6;
  PacketQueueBase *pPVar7;
  
  sVar1 = q1->total_size;
  sVar2 = q2->total_size;
  pPVar4 = (PacketQueueBase *)(q1->end).prev;
  pPVar7 = (PacketQueueBase *)0x0;
  if (pPVar4 == q1) {
    pPVar4 = pPVar7;
  }
  pPVar6 = (PacketQueueBase *)(q2->end).next;
  if (pPVar6 == q2) {
    pPVar6 = pPVar7;
  }
  pPVar3 = (PacketQueueBase *)(q2->end).prev;
  if (pPVar3 == q2) {
    pPVar3 = pPVar7;
  }
  pPVar7 = (PacketQueueBase *)(q1->end).next;
  (q1->end).prev = &q1->end;
  (q1->end).next = &q1->end;
  (q2->end).prev = &q2->end;
  (q2->end).next = &q2->end;
  q2->total_size = 0;
  q1->total_size = 0;
  pPVar5 = pPVar6;
  if (pPVar4 != (PacketQueueBase *)0x0) {
    pPVar5 = (PacketQueueBase *)0x0;
    if (pPVar7 != q1) {
      pPVar5 = pPVar7;
    }
    (pPVar4->end).next = &pPVar6->end;
  }
  if (pPVar6 != (PacketQueueBase *)0x0) {
    (pPVar6->end).prev = &pPVar4->end;
    pPVar4 = pPVar3;
  }
  if ((PacketQueueBase *)(qdest->end).next != qdest) {
    __assert_fail("qdest->end.next == &qdest->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                  0xd6,
                  "void pq_base_concatenate(PacketQueueBase *, PacketQueueBase *, PacketQueueBase *)"
                 );
  }
  if ((PacketQueueBase *)(qdest->end).prev != qdest) {
    __assert_fail("qdest->end.prev == &qdest->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                  0xd7,
                  "void pq_base_concatenate(PacketQueueBase *, PacketQueueBase *, PacketQueueBase *)"
                 );
  }
  if (pPVar5 == (PacketQueueBase *)0x0) {
    if (pPVar4 != (PacketQueueBase *)0x0) {
      __assert_fail("!tail2",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0xdf,
                    "void pq_base_concatenate(PacketQueueBase *, PacketQueueBase *, PacketQueueBase *)"
                   );
    }
  }
  else {
    if (pPVar4 == (PacketQueueBase *)0x0) {
      __assert_fail("tail2",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0xe1,
                    "void pq_base_concatenate(PacketQueueBase *, PacketQueueBase *, PacketQueueBase *)"
                   );
    }
    (qdest->end).next = &pPVar5->end;
    (qdest->end).prev = &pPVar4->end;
    (pPVar5->end).prev = &qdest->end;
    (pPVar4->end).next = &qdest->end;
    if (qdest->ic != (IdempotentCallback *)0x0) {
      queue_idempotent_callback(qdest->ic);
    }
  }
  qdest->total_size = sVar2 + sVar1;
  return;
}

Assistant:

void pq_base_concatenate(PacketQueueBase *qdest,
                         PacketQueueBase *q1, PacketQueueBase *q2)
{
    struct PacketQueueNode *head1, *tail1, *head2, *tail2;

    size_t total_size = q1->total_size + q2->total_size;

    /*
     * Extract the contents from both input queues, and empty them.
     */

    head1 = (q1->end.next == &q1->end ? NULL : q1->end.next);
    tail1 = (q1->end.prev == &q1->end ? NULL : q1->end.prev);
    head2 = (q2->end.next == &q2->end ? NULL : q2->end.next);
    tail2 = (q2->end.prev == &q2->end ? NULL : q2->end.prev);

    q1->end.next = q1->end.prev = &q1->end;
    q2->end.next = q2->end.prev = &q2->end;
    q1->total_size = q2->total_size = 0;

    /*
     * Link the two lists together, handling the case where one or
     * both is empty.
     */

    if (tail1)
        tail1->next = head2;
    else
        head1 = head2;

    if (head2)
        head2->prev = tail1;
    else
        tail2 = tail1;

    /*
     * Check the destination queue is currently empty. (If it was one
     * of the input queues, then it will be, because we emptied both
     * of those just a moment ago.)
     */

    assert(qdest->end.next == &qdest->end);
    assert(qdest->end.prev == &qdest->end);

    /*
     * If our concatenated list has anything in it, then put it in
     * dest.
     */

    if (!head1) {
        assert(!tail2);
    } else {
        assert(tail2);
        qdest->end.next = head1;
        qdest->end.prev = tail2;
        head1->prev = &qdest->end;
        tail2->next = &qdest->end;

        if (qdest->ic)
            queue_idempotent_callback(qdest->ic);
    }

    qdest->total_size = total_size;
}